

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_sum_rows(ggml_context *ctx,ggml_tensor *a)

{
  long lVar1;
  ggml_tensor *pgVar2;
  int64_t aiStack_38 [2];
  int64_t ne [4];
  
  ne[2] = 0;
  ne[3] = 0;
  ne[0] = 1;
  ne[1] = 0;
  for (lVar1 = 3; lVar1 != 6; lVar1 = lVar1 + 1) {
    aiStack_38[lVar1] = a->ne[lVar1 + -2];
  }
  aiStack_38[1] = 0x120c16;
  pgVar2 = ggml_new_tensor(ctx,a->type,4,ne);
  pgVar2->op = GGML_OP_SUM_ROWS;
  pgVar2->src[0] = a;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_sum_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    int64_t ne[GGML_MAX_DIMS] = { 1 };
    for (int i = 1; i < GGML_MAX_DIMS; ++i) {
        ne[i] = a->ne[i];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    result->op     = GGML_OP_SUM_ROWS;
    result->src[0] = a;

    return result;
}